

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O2

TimeStamp Js::Profiler::GetFrequency(void)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  LARGE_INTEGER in_RAX;
  TimeStamp TVar4;
  undefined4 *puVar5;
  LARGE_INTEGER local_18;
  LARGE_INTEGER tmp;
  
  local_18 = in_RAX;
  BVar3 = QueryPerformanceFrequency(&local_18);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                ,0x1f8,"(0)","Could not get time. Don\'t know what to do");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    TVar4 = 0;
  }
  else {
    TVar4 = local_18.QuadPart / 1000;
  }
  return TVar4;
}

Assistant:

TimeStamp
    Profiler::GetFrequency()
    {
#if !defined HIRES_PROFILER && (defined(_M_IX86) || defined(_M_X64))
        long long start, end;
        int CPUInfo[4];

        // Flush pipeline
        __cpuid(CPUInfo, 0);

        // Measure 1 second / 5
        start = GetTime();
        Sleep(1000/5);
        end = GetTime();

        return  ((end - start) * 5) / FrequencyScale;
#else
        LARGE_INTEGER tmp;
        if(QueryPerformanceFrequency(&tmp))
        {
            return tmp.QuadPart / FrequencyScale;
        }
        else
        {
            AssertMsg(0, "Could not get time. Don't know what to do");
            return 0;
        }
#endif
    }